

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall
pugi::impl::anon_unknown_0::xml_parser::parse_doctype_ignore(xml_parser *this,char_t *s)

{
  char cVar1;
  char_t *s_00;
  
  if (((*s != '<') || (s[1] != '!')) || (s[2] != '[')) {
    __assert_fail("s[0] == \'<\' && s[1] == \'!\' && s[2] == \'[\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x841,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_ignore(char_t *)"
                 );
  }
  s_00 = s + 1;
  do {
    for (; cVar1 = *s_00, cVar1 != '<'; s_00 = s_00 + 1) {
      if (cVar1 == ']') {
        if ((s_00[1] == ']') && (s_00[2] == '>')) {
          return s_00 + 3;
        }
      }
      else if (cVar1 == '\0') {
        this->error_offset = s_00;
        this->error_status = status_bad_doctype;
        return (char_t *)0x0;
      }
LAB_0011d8e3:
    }
    if ((s_00[1] != '!') || (s_00[2] != '[')) goto LAB_0011d8e3;
    s_00 = parse_doctype_ignore(this,s_00);
    if (s_00 == (char_t *)0x0) {
      return (char_t *)0x0;
    }
  } while( true );
}

Assistant:

char_t* parse_doctype_ignore(char_t* s)
		{
			assert(s[0] == '<' && s[1] == '!' && s[2] == '[');
			s++;

			while (*s)
			{
				if (s[0] == '<' && s[1] == '!' && s[2] == '[')
				{
					// nested ignore section
					s = parse_doctype_ignore(s);
					if (!s) return s;
				}
				else if (s[0] == ']' && s[1] == ']' && s[2] == '>')
				{
					// ignore section end
					s += 3;

					return s;
				}
				else s++;
			}

			PUGI__THROW_ERROR(status_bad_doctype, s);
		}